

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this,
          TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *gel)

{
  long lVar1;
  int64_t *piVar2;
  int64_t *piVar3;
  byte bVar4;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  bVar4 = 0;
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018affa0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018afbf8,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018af8f8;
  (this->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018b5158;
  piVar2 = (gel->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes;
  piVar3 = (this->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *piVar3 = *piVar2;
    piVar2 = piVar2 + (ulong)bVar4 * -2 + 1;
    piVar3 = piVar3 + (ulong)bVar4 * -2 + 1;
  }
  (this->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticTetra_018b50d0;
  lVar1 = 0xa8;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x58) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x210);
  lVar1 = 0x98;
  do {
    TPZGeoElSide::TPZGeoElSide
              (&local_48,
               (TPZGeoElSideIndex *)
               ((long)(this->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes +
               lVar1 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&local_60,
               (TPZGeoElSideIndex *)
               ((long)(gel->fGeo).super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes +
               lVar1 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&local_48,&local_60);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x200);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}